

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  Reader reader_01;
  undefined8 in_stack_fffffffffffffd70;
  Reader local_280;
  Reader local_248;
  Schema local_218;
  Schema SStack_210;
  SegmentBuilder *local_208;
  CapTableBuilder *pCStack_200;
  void *local_1f8;
  WirePointer *pWStack_1f0;
  Reader local_1e8;
  Reader local_1b0;
  Reader local_180;
  Schema local_138;
  undefined1 auStack_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase93 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_138.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_138.raw);
  DynamicStruct::Builder::asReader(&local_180,(Builder *)auStack_130);
  reader_01.reader.segment = (SegmentReader *)local_180.reader.capTable;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_180.reader.segment;
  reader_01.reader.capTable = (CapTableReader *)local_180.reader.data;
  reader_01.reader.data = local_180.reader.pointers;
  reader_01.reader.pointers = (WirePointer *)local_180.reader._32_8_;
  reader_01.reader.dataSize = local_180.reader.nestingLimit;
  reader_01.reader.pointerCount = local_180.reader._44_2_;
  reader_01.reader._38_2_ = local_180.reader._46_2_;
  reader_01.reader._40_8_ = in_stack_fffffffffffffd70;
  checkDynamicTestMessageAllZero(reader_01);
  DynamicStruct::Builder::asReader(&local_1e8,(Builder *)auStack_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_1b0,&local_1e8);
  reader._reader.capTable = (CapTableReader *)local_1b0._reader.data;
  reader._reader.segment = (SegmentReader *)local_1b0._reader.capTable;
  reader._reader.data = local_1b0._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1b0._reader._32_8_;
  reader._reader.dataSize = local_1b0._reader.nestingLimit;
  reader._reader.pointerCount = local_1b0._reader._44_2_;
  reader._reader._38_2_ = local_1b0._reader._46_2_;
  reader._reader.nestingLimit = local_180.reader.nestingLimit;
  reader._reader._44_4_ = local_180.reader._44_4_;
  checkTestMessageAllZero(reader);
  local_1f8 = root.builder.data;
  pWStack_1f0 = root.builder.pointers;
  local_208 = root.builder.segment;
  pCStack_200 = root.builder.capTable;
  local_218.raw = (RawBrandedSchema *)auStack_130;
  SStack_210 = root.schema.super_Schema.raw;
  builder_00.builder.segment = root.builder.segment;
  builder_00.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_00.builder.capTable = root.builder.capTable;
  builder_00.builder.data = root.builder.data;
  builder_00.builder.pointers = root.builder.pointers;
  builder_00.builder.dataSize = local_180.reader.nestingLimit;
  builder_00.builder.pointerCount = local_180.reader._44_2_;
  builder_00.builder._38_2_ = local_180.reader._46_2_;
  checkDynamicTestMessageAllZero(builder_00);
  DynamicStruct::Builder::asReader(&local_280,(Builder *)auStack_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestAllTypes>(&local_248,&local_280);
  reader_00._reader.capTable = (CapTableReader *)local_248._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_248._reader.capTable;
  reader_00._reader.data = local_248._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_248._reader._32_8_;
  reader_00._reader.dataSize = local_248._reader.nestingLimit;
  reader_00._reader.pointerCount = local_248._reader._44_2_;
  reader_00._reader._38_2_ = local_248._reader._46_2_;
  reader_00._reader.nestingLimit = local_180.reader.nestingLimit;
  reader_00._reader._44_4_ = local_180.reader._44_4_;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, Zero) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  checkDynamicTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
  checkDynamicTestMessageAllZero(root);
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
}